

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O0

int Doolittle64(uchar *mat,int *pivot,int n)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int j_2;
  int j_1;
  int k_8_aligned;
  int k_1_aligned;
  uchar tmp_1;
  uchar mask_prepending;
  uint64_t mask_ik;
  int i;
  int c;
  uint64_t mask_cpy;
  uint64_t j;
  uint64_t tmp;
  int k;
  uint64_t *mat_64_ptr;
  int local_6c;
  int local_64;
  int local_50;
  int local_4c;
  ulong local_40;
  int local_2c;
  int local_4;
  
  local_2c = 0;
  while( true ) {
    if (in_EDX + -1 <= local_2c) {
      *(int *)(in_RSI + (long)(in_EDX + -1) * 4) = in_EDX + -1;
      if ((*(byte *)(in_RDI + ((in_EDX / 8) * (in_EDX + -1) + in_EDX / 8 + -1)) & 1) == 0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
      return local_4;
    }
    *(int *)(in_RSI + (long)local_2c * 4) = local_2c;
    for (local_40 = (ulong)(local_2c + 1); local_40 < (ulong)(long)in_EDX; local_40 = local_40 + 1)
    {
      uVar3 = -(long)(int)((int)(uint)*(byte *)(in_RDI + (long)(in_EDX / 8) * local_40 +
                                                         (long)(local_2c / 8)) >>
                           (7U - (char)(local_2c % 8) & 0x1f) & 1U &
                          (uint)((((int)(uint)*(byte *)(in_RDI + ((in_EDX / 8) * local_2c +
                                                                 local_2c / 8)) >>
                                   (7U - (char)(local_2c % 8) & 0x1f) & 1U) != 0 ^ 0xffU) & 1));
      for (local_4c = 0; local_4c < in_EDX / 0x40; local_4c = local_4c + 1) {
        uVar1 = *(ulong *)(in_RDI + ((long)(in_EDX / 0x40) * local_40 + (long)local_4c) * 8);
        *(ulong *)(in_RDI + ((long)(in_EDX / 0x40) * local_40 + (long)local_4c) * 8) =
             *(ulong *)(in_RDI + ((long)(in_EDX / 0x40) * local_40 + (long)local_4c) * 8) &
             (uVar3 ^ 0xffffffffffffffff) |
             *(ulong *)(in_RDI + (long)((in_EDX / 0x40) * local_2c + local_4c) * 8) & uVar3;
        *(ulong *)(in_RDI + (long)((in_EDX / 0x40) * local_2c + local_4c) * 8) =
             *(ulong *)(in_RDI + (long)((in_EDX / 0x40) * local_2c + local_4c) * 8) &
             (uVar3 ^ 0xffffffffffffffff) | uVar1 & uVar3;
      }
      *(uint *)(in_RSI + (long)local_2c * 4) =
           (uint)local_40 & (uint)uVar3 |
           *(uint *)(in_RSI + (long)local_2c * 4) & ((uint)uVar3 ^ 0xffffffff);
    }
    local_50 = local_2c;
    if (((int)(uint)*(byte *)(in_RDI + ((local_2c * in_EDX) / 8 + local_2c / 8)) >>
         (7U - (char)(local_2c % 8) & 0x1f) & 1U) == 0) break;
    while (local_50 = local_50 + 1, local_50 < in_EDX) {
      bVar2 = 7U - (char)(local_2c % 8) & 0x1f;
      iVar6 = (0 >> bVar2) -
              ((int)(uint)*(byte *)(in_RDI + ((local_50 * in_EDX) / 8 + local_2c / 8)) >> bVar2 & 1U
              );
      bVar5 = (char)(0x100 >> ((byte)((long)(local_2c + 1) % 8) & 0x1f)) - 1;
      bVar2 = *(byte *)(in_RDI + ((in_EDX / 8) * local_50 + (local_2c + 1) / 8));
      bVar4 = (byte)iVar6;
      lVar7 = (long)(local_50 * (in_EDX / 8) + (local_2c + 1) / 8);
      *(byte *)(in_RDI + lVar7) =
           *(byte *)(in_RDI + lVar7) ^
           bVar4 & *(byte *)(in_RDI + (local_2c * (in_EDX / 8) + (local_2c + 1) / 8));
      lVar7 = (long)((in_EDX / 8) * local_50 + (local_2c + 1) / 8);
      *(byte *)(in_RDI + lVar7) = *(byte *)(in_RDI + lVar7) & bVar5;
      lVar7 = (long)((in_EDX / 8) * local_50 + (local_2c + 1) / 8);
      *(byte *)(in_RDI + lVar7) = *(byte *)(in_RDI + lVar7) | bVar2 & (bVar5 ^ 0xff);
      for (local_64 = local_2c + (9 - (local_2c + 1) % 8); local_64 < in_EDX && local_64 % 0x40 != 0
          ; local_64 = local_64 + 8) {
        lVar7 = (long)(local_50 * (in_EDX / 8) + local_64 / 8);
        *(byte *)(in_RDI + lVar7) =
             *(byte *)(in_RDI + lVar7) ^
             bVar4 & *(byte *)(in_RDI + (local_2c * (in_EDX / 8) + local_64 / 8));
      }
      for (local_6c = local_64; local_6c < in_EDX; local_6c = local_6c + 0x40) {
        lVar7 = (long)(local_50 * (in_EDX / 0x40) + local_6c / 0x40);
        *(ulong *)(in_RDI + lVar7 * 8) =
             (long)iVar6 &
             *(ulong *)(in_RDI + (long)(local_2c * (in_EDX / 0x40) + local_6c / 0x40) * 8) ^
             *(ulong *)(in_RDI + lVar7 * 8);
      }
    }
    local_2c = local_2c + 1;
  }
  return -1;
}

Assistant:

int Doolittle64(unsigned char *mat, int *pivot, int n)
{
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    uint64_t tmp;
    for(uint64_t j = k+1; j < n; j++)
    {
      uint64_t mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/64; c++)
      {
        // copy in 32 bit chunks
        tmp = mat_64_ptr[(n/64)*j + c];
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*k + c] & mask_cpy);
        mat_64_ptr[(n/64)*k + c] = (mat_64_ptr[(n/64)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      uint64_t mask_ik = 0x0000000000000000 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;

      // handle byte-aligned chunks until we are 8-byte aligned
      int k_1_aligned = k+1 + (8-((k+1)%8));
      int k_8_aligned = k_1_aligned;
      for(int j = k_1_aligned; (j < n) && ((j%64) != 0); j += 8)
      {
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
        k_8_aligned = j+8;
      }

      /*
       * now handle the rest of the row efficiently in 4-byte-aligned byte-chunks
       */
      for(int j = k_8_aligned; j < n; j += 64)
      {
        mat_64_ptr[i*(n/64) + j/64] ^= mask_ik & mat_64_ptr[k*(n/64) + j/64];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}